

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrsv.c
# Opt level: O0

void dtrsv_(char *uplo,char *trans,char *diag,integer *n,doublereal *a,integer *lda,doublereal *x,
           integer *incx)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int local_68;
  int local_5c;
  logical nounit;
  integer kx;
  integer jx;
  integer ix;
  integer j;
  integer i;
  doublereal temp;
  integer *piStack_38;
  integer info;
  integer *lda_local;
  doublereal *a_local;
  integer *n_local;
  char *diag_local;
  char *trans_local;
  char *uplo_local;
  
  temp._4_4_ = 0;
  piStack_38 = lda;
  lda_local = (integer *)a;
  a_local = (doublereal *)n;
  n_local = (integer *)diag;
  diag_local = trans;
  trans_local = uplo;
  iVar2 = strncmp(uplo,"U",1);
  if ((iVar2 == 0) || (iVar2 = strncmp(trans_local,"L",1), iVar2 == 0)) {
    iVar2 = strncmp(diag_local,"N",1);
    if (((iVar2 == 0) || (iVar2 = strncmp(diag_local,"T",1), iVar2 == 0)) ||
       (iVar2 = strncmp(diag_local,"C",1), iVar2 == 0)) {
      iVar2 = strncmp((char *)n_local,"U",1);
      if ((iVar2 == 0) || (iVar2 = strncmp((char *)n_local,"N",1), iVar2 == 0)) {
        if (*(int *)a_local < 0) {
          temp._4_4_ = 4;
        }
        else {
          if (*(int *)a_local < 2) {
            local_68 = 1;
          }
          else {
            local_68 = *(int *)a_local;
          }
          if (*piStack_38 < local_68) {
            temp._4_4_ = 6;
          }
          else if (*incx == 0) {
            temp._4_4_ = 8;
          }
        }
      }
      else {
        temp._4_4_ = 3;
      }
    }
    else {
      temp._4_4_ = 2;
    }
  }
  else {
    temp._4_4_ = 1;
  }
  if (temp._4_4_ == 0) {
    if (*(int *)a_local != 0) {
      iVar2 = strncmp((char *)n_local,"N",1);
      bVar3 = iVar2 == 0;
      if (*incx < 1) {
        local_5c = 1 - (*(int *)a_local + -1) * *incx;
      }
      else if (*incx != 1) {
        local_5c = 1;
      }
      iVar2 = strncmp(diag_local,"N",1);
      if (iVar2 == 0) {
        iVar2 = strncmp(trans_local,"U",1);
        if (iVar2 == 0) {
          if (*incx == 1) {
            for (jx = *(integer *)a_local; 0 < jx; jx = jx + -1) {
              if ((x[jx + -1] != 0.0) || (NAN(x[jx + -1]))) {
                if (bVar3) {
                  x[jx + -1] = x[jx + -1] /
                               *(double *)
                                (lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
                }
                dVar1 = x[jx + -1];
                iVar2 = jx;
                while (ix = iVar2 + -1, 0 < ix) {
                  x[iVar2 + -2] =
                       -dVar1 * *(double *)
                                 (lda_local + (long)(iVar2 + -2 + (jx + -1) * *piStack_38) * 2) +
                       x[iVar2 + -2];
                  iVar2 = ix;
                }
              }
            }
          }
          else {
            nounit = local_5c + (*(int *)a_local + -1) * *incx;
            for (jx = *(integer *)a_local; 0 < jx; jx = jx + -1) {
              if ((x[nounit + -1] != 0.0) || (NAN(x[nounit + -1]))) {
                if (bVar3) {
                  x[nounit + -1] =
                       x[nounit + -1] /
                       *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
                }
                dVar1 = x[nounit + -1];
                kx = nounit;
                iVar2 = jx;
                while (ix = iVar2 + -1, 0 < ix) {
                  kx = kx - *incx;
                  x[kx + -1] = -dVar1 * *(double *)
                                         (lda_local +
                                         (long)(iVar2 + -2 + (jx + -1) * *piStack_38) * 2) +
                               x[kx + -1];
                  iVar2 = ix;
                }
              }
              nounit = nounit - *incx;
            }
          }
        }
        else if (*incx == 1) {
          for (jx = 1; jx <= *(int *)a_local; jx = jx + 1) {
            if ((x[jx + -1] != 0.0) || (NAN(x[jx + -1]))) {
              if (bVar3) {
                x[jx + -1] = x[jx + -1] /
                             *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
              }
              dVar1 = x[jx + -1];
              iVar2 = jx;
              while (ix = iVar2 + 1, ix <= *(int *)a_local) {
                x[iVar2] = -dVar1 * *(double *)
                                     (lda_local + (long)(iVar2 + (jx + -1) * *piStack_38) * 2) +
                           x[iVar2];
                iVar2 = ix;
              }
            }
          }
        }
        else {
          nounit = local_5c;
          for (jx = 1; jx <= *(int *)a_local; jx = jx + 1) {
            if ((x[nounit + -1] != 0.0) || (NAN(x[nounit + -1]))) {
              if (bVar3) {
                x[nounit + -1] =
                     x[nounit + -1] /
                     *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
              }
              dVar1 = x[nounit + -1];
              kx = nounit;
              iVar2 = jx;
              while (ix = iVar2 + 1, ix <= *(int *)a_local) {
                kx = *incx + kx;
                x[kx + -1] = -dVar1 * *(double *)
                                       (lda_local + (long)(iVar2 + (jx + -1) * *piStack_38) * 2) +
                             x[kx + -1];
                iVar2 = ix;
              }
            }
            nounit = *incx + nounit;
          }
        }
      }
      else {
        iVar2 = strncmp(trans_local,"U",1);
        if (iVar2 == 0) {
          if (*incx == 1) {
            for (jx = 1; jx <= *(int *)a_local; jx = jx + 1) {
              _j = x[jx + -1];
              for (ix = 1; ix <= jx + -1; ix = ix + 1) {
                _j = -*(double *)(lda_local + (long)(ix + -1 + (jx + -1) * *piStack_38) * 2) *
                     x[ix + -1] + _j;
              }
              if (bVar3) {
                _j = _j / *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
              }
              x[jx + -1] = _j;
            }
          }
          else {
            nounit = local_5c;
            for (jx = 1; jx <= *(int *)a_local; jx = jx + 1) {
              _j = x[nounit + -1];
              kx = local_5c;
              for (ix = 1; ix <= jx + -1; ix = ix + 1) {
                _j = -*(double *)(lda_local + (long)(ix + -1 + (jx + -1) * *piStack_38) * 2) *
                     x[kx + -1] + _j;
                kx = *incx + kx;
              }
              if (bVar3) {
                _j = _j / *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
              }
              x[nounit + -1] = _j;
              nounit = *incx + nounit;
            }
          }
        }
        else if (*incx == 1) {
          for (jx = *(integer *)a_local; 0 < jx; jx = jx + -1) {
            _j = x[jx + -1];
            for (ix = *(integer *)a_local; jx + 1 <= ix; ix = ix + -1) {
              _j = -*(double *)(lda_local + (long)(ix + -1 + (jx + -1) * *piStack_38) * 2) *
                   x[ix + -1] + _j;
            }
            if (bVar3) {
              _j = _j / *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
            }
            x[jx + -1] = _j;
          }
        }
        else {
          iVar2 = (*(int *)a_local + -1) * *incx + local_5c;
          nounit = iVar2;
          for (jx = *(integer *)a_local; 0 < jx; jx = jx + -1) {
            _j = x[nounit + -1];
            kx = iVar2;
            for (ix = *(integer *)a_local; jx + 1 <= ix; ix = ix + -1) {
              _j = -*(double *)(lda_local + (long)(ix + -1 + (jx + -1) * *piStack_38) * 2) *
                   x[kx + -1] + _j;
              kx = kx - *incx;
            }
            if (bVar3) {
              _j = _j / *(double *)(lda_local + (long)(jx + -1 + (jx + -1) * *piStack_38) * 2);
            }
            x[nounit + -1] = _j;
            nounit = nounit - *incx;
          }
        }
      }
    }
  }
  else {
    input_error("DTRSV ",(int *)((long)&temp + 4));
  }
  return;
}

Assistant:

void dtrsv_(char *uplo, char *trans, char *diag, integer *n, 
	doublereal *a, integer *lda, doublereal *x, integer *incx)
{


    /* System generated locals */

    /* Local variables */
    integer info;
    doublereal temp;
    integer i, j;
    integer ix, jx, kx;
    logical nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    DTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   A'*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - DOUBLE PRECISION array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - DOUBLE PRECISION array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("DTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j) != 0.) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j - 1; i >= 1; --i) {
			    X(i) -= temp * A(i,j);
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx) != 0.) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    X(ix) -= temp * A(i,j);
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j) != 0.) {
			if (nounit) {
			    X(j) /= A(j,j);
			}
			temp = X(j);
			for (i = j + 1; i <= *n; ++i) {
			    X(i) -= temp * A(i,j);
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx) != 0.) {
			if (nounit) {
			    X(jx) /= A(j,j);
			}
			temp = X(jx);
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    X(ix) -= temp * A(i,j);
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp = X(j);
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(i);
/* L90: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L100: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = 1; i <= j-1; ++i) {
			temp -= A(i,j) * X(ix);
			ix += *incx;
/* L110: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx += *incx;
/* L120: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp = X(j);
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(i);
/* L130: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(j) = temp;
/* L140: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    temp = X(jx);
		    ix = kx;
		    for (i = *n; i >= j+1; --i) {
			temp -= A(i,j) * X(ix);
			ix -= *incx;
/* L150: */
		    }
		    if (nounit) {
			temp /= A(j,j);
		    }
		    X(jx) = temp;
		    jx -= *incx;
/* L160: */
		}
	    }
	}
    }

    return;

/*     End of DTRSV . */

}